

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerHLSL::emit_interface_block_member_in_struct
          (CompilerHLSL *this,SPIRVariable *var,uint32_t member_index,uint32_t location,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *active_locations)

{
  uint32_t uVar1;
  SPIREntryPoint *pSVar2;
  SPIRType *pSVar3;
  Bitset *pBVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string mbr_name;
  string semantic;
  SPIRType type;
  
  pSVar2 = Compiler::get_entry_point((Compiler *)this);
  pSVar3 = Compiler::get<spirv_cross::SPIRType>
                     ((Compiler *)this,*(uint32_t *)&(var->super_IVariant).field_0xc);
  SPIRType::SPIRType(&type,pSVar3);
  ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)var->storage;
  to_semantic_abi_cxx11_(&semantic,this,location,pSVar2->model,var->storage);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
            (&local_220,this,(ulong)type.super_IVariant.self.id,1);
  CompilerGLSL::to_member_name_abi_cxx11_(&local_200,&this->super_CompilerGLSL,&type,member_index);
  join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
            (&mbr_name,(spirv_cross *)&local_220,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2ae00b,
             (char (*) [2])&local_200,ts_2);
  ::std::__cxx11::string::~string((string *)&local_200);
  ::std::__cxx11::string::~string((string *)&local_220);
  pSVar3 = Compiler::get<spirv_cross::SPIRType>
                     ((Compiler *)this,
                      type.member_types.
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                      [member_index].id);
  pBVar4 = Compiler::get_member_decoration_bitset
                     ((Compiler *)this,(TypeID)type.super_IVariant.self.id,member_index);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x35])(&local_220,this,pBVar4);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_200,this,pSVar3,0);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])
            (&local_1e0,this,pSVar3,(ulong)(var->super_IVariant).self.id);
  CompilerGLSL::
  statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
            (&this->super_CompilerGLSL,&local_220,&local_200,(char (*) [2])0x2af68c,&mbr_name,
             &local_1e0,(char (*) [4])0x2d170c,&semantic,(char (*) [2])0x2cce52);
  ::std::__cxx11::string::~string((string *)&local_1e0);
  ::std::__cxx11::string::~string((string *)&local_200);
  ::std::__cxx11::string::~string((string *)&local_220);
  uVar1 = type_to_consumed_locations(this,pSVar3);
  while (bVar5 = uVar1 != 0, uVar1 = uVar1 - 1, bVar5) {
    local_220._M_dataplus._M_p._0_4_ = location;
    ::std::__detail::
    _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)active_locations,(value_type *)&local_220);
    location = location + 1;
  }
  ::std::__cxx11::string::~string((string *)&mbr_name);
  ::std::__cxx11::string::~string((string *)&semantic);
  SPIRType::~SPIRType(&type);
  return;
}

Assistant:

void CompilerHLSL::emit_interface_block_member_in_struct(const SPIRVariable &var, uint32_t member_index,
                                                         uint32_t location,
                                                         std::unordered_set<uint32_t> &active_locations)
{
	auto &execution = get_entry_point();
	auto type = get<SPIRType>(var.basetype);
	auto semantic = to_semantic(location, execution.model, var.storage);
	auto mbr_name = join(to_name(type.self), "_", to_member_name(type, member_index));
	auto &mbr_type = get<SPIRType>(type.member_types[member_index]);

	statement(to_interpolation_qualifiers(get_member_decoration_bitset(type.self, member_index)),
	          type_to_glsl(mbr_type),
	          " ", mbr_name, type_to_array_glsl(mbr_type, var.self),
	          " : ", semantic, ";");

	// Structs and arrays should consume more locations.
	uint32_t consumed_locations = type_to_consumed_locations(mbr_type);
	for (uint32_t i = 0; i < consumed_locations; i++)
		active_locations.insert(location + i);
}